

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3OpenTableAndIndices
              (Parse *pParse,Table *pTab,int op,u8 p5,int iBase,u8 *aToOpen,int *piDataCur,
              int *piIdxCur)

{
  Index *pIdx;
  int iDb;
  Vdbe *p;
  int p1;
  int iVar1;
  long lVar2;
  byte bVar3;
  Index **ppIVar4;
  bool bVar5;
  
  lVar2 = 0;
  if (pTab->nModuleArg == 0) {
    iDb = sqlite3SchemaToIndex(pParse->db,pTab->pSchema);
    p = sqlite3GetVdbe(pParse);
    if (iBase < 0) {
      iBase = pParse->nTab;
    }
    if (piDataCur != (int *)0x0) {
      *piDataCur = iBase;
    }
    if (((pTab->tabFlags & 0x20) == 0) && ((aToOpen == (u8 *)0x0 || (*aToOpen != '\0')))) {
      sqlite3OpenTable(pParse,iBase,iDb,pTab,op);
    }
    else {
      sqlite3TableLock(pParse,iDb,pTab->tnum,op == 0x6d,pTab->zName);
    }
    iVar1 = iBase + 1;
    if (piIdxCur != (int *)0x0) {
      *piIdxCur = iVar1;
    }
    lVar2 = 0;
    ppIVar4 = &pTab->pIndex;
    bVar3 = p5;
    while (pIdx = *ppIVar4, pIdx != (Index *)0x0) {
      p1 = iVar1 + (int)lVar2;
      if ((*(ushort *)&pIdx->field_0x63 & 3) == 2) {
        bVar5 = (pTab->tabFlags & 0x20) != 0;
        p5 = bVar3;
        if (bVar5) {
          p5 = 0;
        }
        bVar3 = p5;
        if (bVar5 && piDataCur != (int *)0x0) {
          *piDataCur = p1;
          bVar3 = 0;
          p5 = 0;
        }
      }
      if ((aToOpen == (u8 *)0x0) || (aToOpen[lVar2 + 1] != '\0')) {
        sqlite3VdbeAddOp3(p,op,p1,pIdx->tnum,iDb);
        sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
        if (0 < (long)p->nOp) {
          p->aOp[(long)p->nOp + -1].p5 = (ushort)p5;
        }
      }
      lVar2 = lVar2 + 1;
      ppIVar4 = &pIdx->pNext;
    }
    iVar1 = iVar1 + (int)lVar2;
    if (pParse->nTab < iVar1) {
      pParse->nTab = iVar1;
    }
  }
  return (int)lVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3OpenTableAndIndices(
  Parse *pParse,   /* Parsing context */
  Table *pTab,     /* Table to be opened */
  int op,          /* OP_OpenRead or OP_OpenWrite */
  u8 p5,           /* P5 value for OP_Open* opcodes (except on WITHOUT ROWID) */
  int iBase,       /* Use this for the table cursor, if there is one */
  u8 *aToOpen,     /* If not NULL: boolean for each table and index */
  int *piDataCur,  /* Write the database source cursor number here */
  int *piIdxCur    /* Write the first index cursor number here */
){
  int i;
  int iDb;
  int iDataCur;
  Index *pIdx;
  Vdbe *v;

  assert( op==OP_OpenRead || op==OP_OpenWrite );
  assert( op==OP_OpenWrite || p5==0 );
  if( IsVirtual(pTab) ){
    /* This routine is a no-op for virtual tables. Leave the output
    ** variables *piDataCur and *piIdxCur uninitialized so that valgrind
    ** can detect if they are used by mistake in the caller. */
    return 0;
  }
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  if( iBase<0 ) iBase = pParse->nTab;
  iDataCur = iBase++;
  if( piDataCur ) *piDataCur = iDataCur;
  if( HasRowid(pTab) && (aToOpen==0 || aToOpen[0]) ){
    sqlite3OpenTable(pParse, iDataCur, iDb, pTab, op);
  }else{
    sqlite3TableLock(pParse, iDb, pTab->tnum, op==OP_OpenWrite, pTab->zName);
  }
  if( piIdxCur ) *piIdxCur = iBase;
  for(i=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
    int iIdxCur = iBase++;
    assert( pIdx->pSchema==pTab->pSchema );
    if( IsPrimaryKeyIndex(pIdx) && !HasRowid(pTab) ){
      if( piDataCur ) *piDataCur = iIdxCur;
      p5 = 0;
    }
    if( aToOpen==0 || aToOpen[i+1] ){
      sqlite3VdbeAddOp3(v, op, iIdxCur, pIdx->tnum, iDb);
      sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
      sqlite3VdbeChangeP5(v, p5);
      VdbeComment((v, "%s", pIdx->zName));
    }
  }
  if( iBase>pParse->nTab ) pParse->nTab = iBase;
  return i;
}